

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

uint __thiscall
embree::SubdivMesh::getOppositeHalfEdge(SubdivMesh *this,uint topologyID,uint edgeID)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if ((this->topology).size_active <= (ulong)topologyID) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid topology","");
    *puVar1 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar1 + 1) = 2;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30);
    __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if ((ulong)edgeID < this->numHalfEdges) {
    return edgeID + (this->topology).items[topologyID].halfEdges.items[edgeID].
                    opposite_half_edge_ofs;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid half edge","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

unsigned int SubdivMesh::getOppositeHalfEdge(unsigned int topologyID, unsigned int edgeID)
  {
    if (topologyID >= topology.size())
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid topology");
    
    if (edgeID >= numHalfEdges)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid half edge");

    return edgeID + topology[topologyID].halfEdges[edgeID].opposite_half_edge_ofs;
  }